

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O3

double fppow2(int n)

{
  int iVar1;
  uint uVar2;
  double dVar3;
  
  if (n != 0) {
    iVar1 = -n;
    if (n != iVar1 && SBORROW4(n,iVar1) == n * 2 < 0) {
      iVar1 = n;
    }
    uVar2 = iVar1 + 1;
    dVar3 = 1.0;
    do {
      dVar3 = dVar3 * *(double *)(&DAT_001728a0 + (ulong)((uint)n >> 0x1f) * 8);
      uVar2 = uVar2 - 1;
    } while (1 < uVar2);
    return dVar3;
  }
  return 1.0;
}

Assistant:

double fppow2(int n)
{
  double x, power;
  x = (n < 0) ? ((double)1.0/(double)2.0) : (double)2.0;
  n = (n < 0) ? -n : n;
  power = (double)1.0;
  while (n-- > 0)
	power *= x;
  return (power);
}